

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeDSK.cpp
# Opt level: O1

int __thiscall
FormatTypeDSK::LoadDisk
          (FormatTypeDSK *this,uchar *buffer,size_t size,IDisk **created_disk,
          ILoadingProgress *loading_progress)

{
  Side *pSVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  Sector *pSVar6;
  int iVar7;
  uint uVar8;
  byte bVar9;
  IDisk *this_00;
  void *pvVar10;
  Sector *pSVar11;
  void *pvVar12;
  MFMTrack *pMVar13;
  undefined8 *puVar14;
  uchar *__s;
  uint uVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  Track *pTVar20;
  ulong uVar21;
  long lVar22;
  Track *pTVar23;
  long lVar24;
  uint local_88;
  uint local_48;
  
  iVar17 = -1;
  if (*(long *)buffer == 0x435043202d20564d) {
    this_00 = (IDisk *)operator_new(0x68);
    IDisk::IDisk(this_00);
    bVar2 = buffer[0x30];
    bVar3 = buffer[0x31];
    bVar9 = 2;
    if (bVar3 < 2) {
      bVar9 = bVar3;
    }
    this_00->nb_sides_ = bVar9;
    uVar4 = *(ushort *)(buffer + 0x32);
    uVar18 = (ulong)uVar4 - 0x100;
    if (bVar3 != 0) {
      uVar19 = (ulong)((uint)bVar2 * 8) * 5;
      lVar24 = 0;
      do {
        (&this->side_[0].nb_tracks)[lVar24] = bVar2;
        pvVar10 = operator_new__(uVar19);
        *(void **)((long)&this->side_[0].tracks + lVar24) = pvVar10;
        memset(pvVar10,0,uVar19);
        lVar24 = lVar24 + 0x10;
      } while ((ulong)bVar9 * 0x10 != lVar24);
    }
    pvVar10 = operator_new__(uVar18);
    local_88 = (uint)bVar2;
    if (this_00->nb_sides_ != '\0' && local_88 != 0) {
      uVar15 = 0;
      iVar17 = 0x100;
      do {
        bVar2 = buffer[(long)iVar17 + 0x11];
        memcpy(pvVar10,buffer + (long)iVar17 + 0x100,uVar18);
        bVar3 = this->side_[bVar2].nb_tracks;
        uVar16 = bVar3 - 1;
        if (buffer[(long)iVar17 + 0x10] < bVar3) {
          uVar16 = (uint)buffer[(long)iVar17 + 0x10];
        }
        bVar3 = buffer[(long)iVar17 + 0x14];
        pTVar23 = this->side_[bVar2].tracks;
        pTVar23[uVar16].sz = bVar3;
        pTVar23[uVar16].sector_size = 0x80 << (bVar3 & 0x1f);
        bVar3 = buffer[(long)iVar17 + 0x15];
        pTVar23[uVar16].nb_sector = (uint)bVar3;
        pTVar23[uVar16].gap3 = buffer[(long)iVar17 + 0x16];
        pTVar23[uVar16].gap3_filter = 'N';
        pSVar11 = (Sector *)operator_new__((ulong)bVar3 * 0x18);
        pTVar23[uVar16].sectors = pSVar11;
        uVar5 = pTVar23[uVar16].nb_sector;
        if ((ulong)uVar5 != 0) {
          pSVar6 = pTVar23[uVar16].sectors;
          uVar8 = pTVar23[uVar16].sector_size;
          lVar24 = 0;
          lVar22 = 0;
          do {
            iVar7 = (int)lVar24;
            (&pSVar6->track)[lVar22] = buffer[(ulong)(iVar7 + 0x18) + (long)iVar17];
            (&pSVar11->side)[lVar22] = buffer[(ulong)(iVar7 + 0x19) + (long)iVar17];
            (&pSVar11->sector_id)[lVar22] = buffer[(ulong)(iVar7 + 0x1a) + (long)iVar17];
            (&pSVar11->sector_size)[lVar22] = buffer[(ulong)(iVar7 + 0x1b) + (long)iVar17];
            (&pSVar11->fdc_status_1)[lVar22] = buffer[(ulong)(iVar7 + 0x1c) + (long)iVar17];
            (&pSVar11->fdc_status_2)[lVar22] = buffer[(ulong)(iVar7 + 0x1d) + (long)iVar17];
            *(short *)((long)&pSVar6->actual_size + lVar22) = (short)uVar8;
            lVar22 = lVar22 + 0x18;
            lVar24 = lVar24 + 8;
          } while ((ulong)uVar5 << 3 != lVar24);
        }
        pTVar23 = this->side_[bVar2].tracks;
        if (pTVar23[uVar16].nb_sector != 0) {
          uVar19 = 0;
          lVar24 = 0x10;
          uVar21 = 0;
          do {
            pTVar20 = pTVar23 + uVar16;
            pvVar12 = operator_new__((ulong)pTVar20->sector_size);
            *(void **)(&(pTVar23[uVar16].sectors)->track + lVar24) = pvVar12;
            memcpy(*(void **)(&pTVar20->sectors->track + lVar24),(void *)(uVar21 + (long)pvVar10),
                   (ulong)pTVar20->sector_size);
            pTVar23 = this->side_[bVar2].tracks;
            uVar21 = (ulong)((int)uVar21 + pTVar23[uVar16].sector_size);
            uVar19 = uVar19 + 1;
            lVar24 = lVar24 + 0x18;
          } while (uVar19 < pTVar23[uVar16].nb_sector);
        }
        local_48 = (uint)uVar4;
        iVar17 = iVar17 + local_48;
        uVar15 = uVar15 + 1;
      } while (uVar15 < this_00->nb_sides_ * local_88);
    }
    operator_delete__(pvVar10);
    if (this_00->nb_sides_ != '\0') {
      uVar18 = 0;
      do {
        bVar2 = this->side_[uVar18].nb_tracks;
        uVar19 = (ulong)bVar2;
        uVar21 = (ulong)bVar2 << 5;
        if (bVar2 < 0x2a) {
          uVar21 = 0x540;
        }
        pMVar13 = (MFMTrack *)operator_new__(uVar21);
        pSVar1 = this_00->side_ + uVar18;
        this_00->side_[uVar18].tracks = pMVar13;
        this_00->side_[uVar18].nb_tracks = (uint)bVar2;
        if (bVar2 != 0) {
          lVar24 = 0;
          uVar21 = 0;
          do {
            pMVar13 = pSVar1->tracks;
            *(undefined4 *)((long)&pMVar13->nb_revolutions + lVar24) = 1;
            puVar14 = (undefined8 *)operator_new__(0x38);
            *puVar14 = 1;
            puVar14[3] = 0;
            puVar14[4] = 0;
            puVar14[5] = 0;
            *(undefined8 **)((long)&pMVar13->revolution + lVar24) = puVar14 + 1;
            uVar15 = FillTrack(this,(uchar *)0x0,(int)uVar18,(int)uVar21);
            pMVar13 = pSVar1->tracks;
            *(uint *)(*(long *)((long)&pMVar13->revolution + lVar24) + 8) = uVar15;
            if (uVar15 < 0x40000) {
              uVar19 = 0x40000;
            }
            else {
              uVar19 = (ulong)uVar15;
            }
            pvVar10 = operator_new__(uVar19);
            puVar14 = *(undefined8 **)((long)&pMVar13->revolution + lVar24);
            *puVar14 = pvVar10;
            memset(pvVar10,0,(ulong)*(uint *)(puVar14 + 1));
            FillTrack(this,(uchar *)**(undefined8 **)((long)&pSVar1->tracks->revolution + lVar24),
                      (int)uVar18,(int)uVar21);
            uVar21 = uVar21 + 1;
            uVar19 = (ulong)pSVar1->nb_tracks;
            lVar24 = lVar24 + 0x20;
          } while (uVar21 < uVar19);
        }
        if ((uint)uVar19 < 0x2a) {
          pMVar13 = pSVar1->tracks + uVar19;
          do {
            uVar19 = uVar19 + 1;
            pMVar13->nb_revolutions = 1;
            puVar14 = (undefined8 *)operator_new__(0x38);
            *puVar14 = 1;
            puVar14[3] = 0;
            puVar14[4] = 0;
            puVar14[5] = 0;
            pMVar13->revolution = (Revolution *)(puVar14 + 1);
            *(undefined4 *)(puVar14 + 2) = 0x40000;
            __s = (uchar *)operator_new__(0x40000);
            pMVar13->revolution->bitfield = __s;
            memset(__s,0,0x40000);
            pMVar13 = pMVar13 + 1;
          } while ((int)uVar19 != 0x2a);
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 < this_00->nb_sides_);
    }
    (*this_00->_vptr_IDisk[0x14])(this_00);
    *created_disk = this_00;
    iVar17 = 0;
  }
  return iVar17;
}

Assistant:

int FormatTypeDSK::LoadDisk(const unsigned char* buffer, size_t size, IDisk*& created_disk,
                            ILoadingProgress* loading_progress)
{
   if (memcmp(buffer, "MV - CPC", 8) == 0)
   {
      IDisk* new_disk = new IDisk();

      // Name of creator : don't read
      // Number of tracks, and sides
      int nb_tracks = buffer[0x30];
      new_disk->nb_sides_ = buffer[0x31];

      if (new_disk->nb_sides_ > 2)
      {
         // ERROR ! Handle or correct ?
         new_disk->nb_sides_ = 2;
      }

      // Size of tracks
      int size_of_track = (buffer[0x32] + ((buffer[0x33]) << 8)) - 0x100;
      //m_NbSide = m_NbSide;

      // Format disk on memory
      int i, j;
      unsigned int k;
      for (i = 0; i < new_disk->nb_sides_; i++)
      {
         side_[i].nb_tracks = nb_tracks;
         side_[i].tracks = new Track[side_[i].nb_tracks];
         memset(side_[i].tracks, 0, sizeof(Track) * side_[i].nb_tracks);
      }


      // Read the tracks
      unsigned char* track_block = new unsigned char[size_of_track];

      int index_buffer = 0x100;
      for (j = 0; j < nb_tracks * new_disk->nb_sides_; j++)
      {
         const unsigned char* header = &buffer[index_buffer];
         index_buffer += 0x100;

         //fread(header, 0x100, 1, file);
         // Side number
         i = header[0x11];

         //fread(TrackBlock, m_SizeOfTrack, 1, file);
         memcpy(track_block, &buffer[index_buffer], size_of_track);
         index_buffer += size_of_track;
         // Track number
         unsigned int tn = header[0x10];
         if (tn >= side_[i].nb_tracks)
         {
            // bug...
            tn = side_[i].nb_tracks - 1;
         }
         unsigned char sector_size = side_[i].tracks[tn].sz = header[0x14];
         //SZ = sectorSize_L;
         side_[i].tracks[tn].sector_size = (0x80 << sector_size);
         // Number of sector
         side_[i].tracks[tn].nb_sector = header[0x15];
         side_[i].tracks[tn].gap3 = header[0x16];
         side_[i].tracks[tn].gap3_filter = 0x4E; // header [0x17];
         side_[i].tracks[tn].sectors = new Sector[side_[i].tracks[tn].nb_sector];
         // Sector info
         for (k = 0; k < side_[i].tracks[tn].nb_sector; k++)
         {
            side_[i].tracks[tn].sectors[k].track = header[0x18 + k * 8 + 00];
            side_[i].tracks[tn].sectors[k].side = header[0x18 + k * 8 + 01];
            side_[i].tracks[tn].sectors[k].sector_id = header[0x18 + k * 8 + 02];
            side_[i].tracks[tn].sectors[k].sector_size = header[0x18 + k * 8 + 03];
            side_[i].tracks[tn].sectors[k].fdc_status_1 = header[0x18 + k * 8 + 04];
            side_[i].tracks[tn].sectors[k].fdc_status_2 = header[0x18 + k * 8 + 05];

            side_[i].tracks[tn].sectors[k].actual_size = side_[i].tracks[tn].sector_size;
         }

         // Data
         unsigned int offset = 0;
         for (k = 0; k < side_[i].tracks[tn].nb_sector; k++)
         {
            side_[i].tracks[tn].sectors[k].data = new unsigned char[side_[i].tracks[tn].sector_size];
            memcpy(side_[i].tracks[tn].sectors[k].data, &track_block[offset], side_[i].tracks[tn].sector_size);
            offset += side_[i].tracks[tn].sector_size;
         }
      }
      delete[]track_block;

      // Fill the MFM structure
      for (int side = 0; side < new_disk->nb_sides_; side++)
      {
         new_disk->side_[side].tracks = new IDisk::MFMTrack[side_[side].nb_tracks < 42 ? 42 : side_[side].nb_tracks];
         new_disk->side_[side].nb_tracks = side_[side].nb_tracks;

         for (unsigned int track = 0; track < new_disk->side_[side].nb_tracks; track++)
         {
            // Init space
            new_disk->side_[side].tracks[track].nb_revolutions = 1; // Only one for DSK files
            new_disk->side_[side].tracks[track].revolution = new IDisk::Revolution[1];

            new_disk->side_[side].tracks[track].revolution[0].size = FillTrack(NULL, side, track);
            if (new_disk->side_[side].tracks[track].revolution[0].size < DEFAULT_TRACK_SIZE * 16)
            {
               new_disk->side_[side].tracks[track].revolution[0].bitfield = new unsigned char[DEFAULT_TRACK_SIZE * 16];
            }
            else
            {
               new_disk->side_[side].tracks[track].revolution[0].bitfield = new unsigned char[new_disk->side_[side].
                  tracks[track].revolution[0].size];
            }
            memset(new_disk->side_[side].tracks[track].revolution[0].bitfield, 0,
                   new_disk->side_[side].tracks[track].revolution[0].size);

            FillTrack(new_disk->side_[side].tracks[track].revolution[0].bitfield, side, track);
         }
         if (new_disk->side_[side].nb_tracks < 42)
         {
            for (unsigned int track = new_disk->side_[side].nb_tracks; track < 42; track++)
            {
               new_disk->side_[side].tracks[track].nb_revolutions = 1; // Only one for DSK files
               new_disk->side_[side].tracks[track].revolution = new IDisk::Revolution[1];

               new_disk->side_[side].tracks[track].revolution[0].size = DEFAULT_TRACK_SIZE * 16;
               new_disk->side_[side].tracks[track].revolution[0].bitfield = new unsigned char[new_disk->side_[side].
                  tracks[track].revolution[0].size];
               memset(new_disk->side_[side].tracks[track].revolution[0].bitfield, 0, DEFAULT_TRACK_SIZE * 16);
            }
         }
      }
      new_disk->CreateTrackFromMultiRevolutions();

      created_disk = new_disk;

      return OK;
   }
   return FILE_ERROR;
}